

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BiasLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_bias(NeuralNetworkLayer *this)

{
  bool bVar1;
  BiasLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_bias(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_bias(this);
    this_00 = (BiasLayerParams *)operator_new(0x38);
    BiasLayerParams::BiasLayerParams(this_00);
    (this->layer_).bias_ = this_00;
  }
  return (BiasLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BiasLayerParams* NeuralNetworkLayer::mutable_bias() {
  if (!has_bias()) {
    clear_layer();
    set_has_bias();
    layer_.bias_ = new ::CoreML::Specification::BiasLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.bias)
  return layer_.bias_;
}